

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::SectionInfo::hasUntestedSections(SectionInfo *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_28;
  const_iterator itEnd;
  const_iterator it;
  SectionInfo *this_local;
  
  if (this->m_status == Unknown) {
    this_local._7_1_ = true;
  }
  else {
    itEnd = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>_>_>
            ::begin(&this->m_subSections);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>_>_>
         ::end(&this->m_subSections);
    while (bVar1 = std::operator!=(&itEnd,&local_28), bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>_>
               ::operator->(&itEnd);
      bVar1 = hasUntestedSections(ppVar2->second);
      if (bVar1) {
        return true;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionInfo_*>_>
      ::operator++(&itEnd);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool hasUntestedSections() const {
            if( m_status == Unknown )
                return true;

            std::map<std::string, SectionInfo*>::const_iterator it = m_subSections.begin();
            std::map<std::string, SectionInfo*>::const_iterator itEnd = m_subSections.end();
            for(; it != itEnd; ++it ) {
                if( it->second->hasUntestedSections() )
                    return true;
            }
            return false;
        }